

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedBoxShape.cpp
# Opt level: O2

void __thiscall chrono::ChRoundedBoxShape::ArchiveIN(ChRoundedBoxShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::geometry::ChRoundedBox> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChRoundedBoxShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->groundedbox;
  local_28._name = "groundedbox";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChRoundedBoxShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChRoundedBoxShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(groundedbox);
}